

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool __thiscall
ON_RTree::Search(ON_RTree *this,double *a_plane_eqn,double a_min,double a_max,
                _func_bool_void_ptr_ON__INT_PTR *a_resultCallback,void *a_context)

{
  undefined1 local_88 [8];
  ON_RTreeSearchResultCallback result;
  double bounded_plane [6];
  void *a_context_local;
  _func_bool_void_ptr_ON__INT_PTR *a_resultCallback_local;
  double a_max_local;
  double a_min_local;
  double *a_plane_eqn_local;
  ON_RTree *this_local;
  
  if ((((this->m_root == (ON_RTreeNode *)0x0) || (a_plane_eqn == (double *)0x0)) || (a_max < a_min))
     || ((((*a_plane_eqn == 0.0 && (!NAN(*a_plane_eqn))) &&
          ((a_plane_eqn[1] == 0.0 && ((!NAN(a_plane_eqn[1]) && (a_plane_eqn[2] == 0.0)))))) &&
         (!NAN(a_plane_eqn[2]))))) {
    this_local._7_1_ = false;
  }
  else {
    result.m_resultCallback = (ON_RTreeSearchCallback)*a_plane_eqn;
    local_88 = (undefined1  [8])a_context;
    result.m_context = a_resultCallback;
    this_local._7_1_ =
         SearchBoundedPlaneXYZHelper
                   (this->m_root,(double *)&result.m_resultCallback,
                    (ON_RTreeSearchResultCallback *)local_88);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_RTree::Search(
  const double a_plane_eqn[4],
  double a_min,
  double a_max,
  bool ON_CALLBACK_CDECL a_resultCallback(void* a_context, ON__INT_PTR a_id),
  void* a_context
  ) const
{
  if (    0 == m_root 
       || 0 == a_plane_eqn 
       || !(a_min <= a_max) 
       || (0.0 == a_plane_eqn[0] && 0.0 == a_plane_eqn[1] && 0.0 == a_plane_eqn[2])
     )
    return false;

  double bounded_plane[6];
  bounded_plane[0] = a_plane_eqn[0];
  bounded_plane[1] = a_plane_eqn[1];
  bounded_plane[2] = a_plane_eqn[2];
  bounded_plane[3] = a_plane_eqn[3];
  bounded_plane[4] = a_min;
  bounded_plane[5] = a_max;

  ON_RTreeSearchResultCallback result;
  result.m_context = a_context;
  result.m_resultCallback = a_resultCallback;

  return SearchBoundedPlaneXYZHelper(m_root, bounded_plane, result);
}